

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::InsertSub
          (TPZMatrix<std::complex<long_double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<long_double>_> *pA)

{
  int iVar1;
  long lVar2;
  int64_t c;
  long lVar3;
  int64_t col;
  long lVar4;
  long local_80;
  undefined1 local_58 [40];
  
  lVar2 = rowSize + pRow;
  if ((lVar2 <= (pA->super_TPZBaseMatrix).fRow) &&
     (local_80 = sRow, colSize + pCol <= (pA->super_TPZBaseMatrix).fCol)) {
    for (; lVar3 = pCol, lVar4 = sCol, pRow < lVar2; pRow = pRow + 1) {
      for (; lVar3 < colSize + pCol; lVar3 = lVar3 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_58,this,local_80,lVar4);
        (*(pA->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(pA,pRow,lVar3,local_58)
        ;
        lVar4 = lVar4 + 1;
      }
      local_80 = local_80 + 1;
    }
    return 1;
  }
  iVar1 = Error("InsertSub <the sub-matrix is too big that target>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}